

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall ON_Layer::SetPersistentLocking(ON_Layer *this,bool bLockedChild)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
  bVar2 = 0;
  if (bVar1) {
    bVar2 = !bLockedChild * '\b' + 8;
  }
  this->m_extension_bits = this->m_extension_bits & 0xe7 | bVar2;
  return;
}

Assistant:

void ON_Layer::SetPersistentLocking(bool bLockedChild)
{
  const unsigned char and_mask = 0xE7;
  const unsigned char or_bit = ParentIdIsNotNil()
                             ? (bLockedChild ? 0x08 : 0x10)
                             : 0x00;
  m_extension_bits &= and_mask;
  m_extension_bits |= or_bit;
}